

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# F3DAudio.c
# Opt level: O0

void CalculateDoppler(float SpeedOfSound,F3DAUDIO_LISTENER *pListener,F3DAUDIO_EMITTER *pEmitter,
                     F3DAUDIO_VECTOR emitterToListener,float eToLDistance,
                     float *listenerVelocityComponent,float *emitterVelocityComponent,
                     float *DopplerFactor)

{
  float local_64;
  float local_60;
  float local_5c;
  float local_58;
  float scaledSpeedOfSound;
  float *DopplerFactor_local;
  float *emitterVelocityComponent_local;
  float *listenerVelocityComponent_local;
  float eToLDistance_local;
  F3DAUDIO_EMITTER *pEmitter_local;
  F3DAUDIO_LISTENER *pListener_local;
  float SpeedOfSound_local;
  F3DAUDIO_VECTOR emitterToListener_local;
  
  *DopplerFactor = 1.0;
  if ((eToLDistance != 0.0) || (NAN(eToLDistance))) {
    emitterToListener_local.x = emitterToListener.x;
    emitterToListener_local.y = emitterToListener.y;
    *listenerVelocityComponent =
         (emitterToListener.z * (pListener->Velocity).z +
         emitterToListener_local.x * (pListener->Velocity).x +
         emitterToListener_local.y * (pListener->Velocity).y) / eToLDistance;
    *emitterVelocityComponent =
         (emitterToListener.z * (pEmitter->Velocity).z +
         emitterToListener_local.x * (pEmitter->Velocity).x +
         emitterToListener_local.y * (pEmitter->Velocity).y) / eToLDistance;
  }
  else {
    *listenerVelocityComponent = 0.0;
    *emitterVelocityComponent = 0.0;
  }
  if (0.0 < pEmitter->DopplerScaler) {
    local_5c = SpeedOfSound / pEmitter->DopplerScaler;
    local_58 = local_5c;
    if (*listenerVelocityComponent < local_5c) {
      local_58 = *listenerVelocityComponent;
    }
    *listenerVelocityComponent = local_58;
    if (*emitterVelocityComponent < local_5c) {
      local_5c = *emitterVelocityComponent;
    }
    *emitterVelocityComponent = local_5c;
    *DopplerFactor =
         (-pEmitter->DopplerScaler * *listenerVelocityComponent + SpeedOfSound) /
         (-pEmitter->DopplerScaler * *emitterVelocityComponent + SpeedOfSound);
    if (NAN(*DopplerFactor)) {
      *DopplerFactor = 1.0;
    }
    if (*DopplerFactor <= 4.0) {
      if (0.5 < *DopplerFactor || *DopplerFactor == 0.5) {
        local_64 = *DopplerFactor;
      }
      else {
        local_64 = 0.5;
      }
      local_60 = local_64;
    }
    else {
      local_60 = 4.0;
    }
    *DopplerFactor = local_60;
  }
  return;
}

Assistant:

static inline void CalculateDoppler(
	float SpeedOfSound,
	const F3DAUDIO_LISTENER* pListener,
	const F3DAUDIO_EMITTER* pEmitter,
	F3DAUDIO_VECTOR emitterToListener,
	float eToLDistance,
	float* listenerVelocityComponent,
	float* emitterVelocityComponent,
	float* DopplerFactor
) {
	float scaledSpeedOfSound;
	*DopplerFactor = 1.0f;

	/* Project... */
	if (eToLDistance != 0.0f)
	{
		*listenerVelocityComponent =
			VectorDot(emitterToListener, pListener->Velocity) / eToLDistance;
		*emitterVelocityComponent =
			VectorDot(emitterToListener, pEmitter->Velocity) / eToLDistance;
	}
	else
	{
		*listenerVelocityComponent = 0.0f;
		*emitterVelocityComponent = 0.0f;
	}

	if (pEmitter->DopplerScaler > 0.0f)
	{
		scaledSpeedOfSound = SpeedOfSound / pEmitter->DopplerScaler;

		/* Clamp... */
		*listenerVelocityComponent = FAudio_min(
			*listenerVelocityComponent,
			scaledSpeedOfSound
		);
		*emitterVelocityComponent = FAudio_min(
			*emitterVelocityComponent,
			scaledSpeedOfSound
		);

		/* ... then Multiply. */
		*DopplerFactor = (
			SpeedOfSound - pEmitter->DopplerScaler * *listenerVelocityComponent
		) / (
			SpeedOfSound - pEmitter->DopplerScaler * *emitterVelocityComponent
		);
		if (isnan(*DopplerFactor)) /* If emitter/listener are at the same pos... */
		{
			*DopplerFactor = 1.0f;
		}

		/* Limit the pitch shifting to 2 octaves up and 1 octave down */
		*DopplerFactor = FAudio_clamp(
			*DopplerFactor,
			0.5f,
			4.0f
		);
	}
}